

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

run_container_t * run_container_create_range(uint32_t start,uint32_t stop)

{
  run_container_t *run;
  short in_SI;
  uint16_t in_DI;
  rle16_t r;
  run_container_t *rc;
  int32_t in_stack_ffffffffffffffec;
  rle16_t vl;
  
  run = run_container_create_given_capacity(in_stack_ffffffffffffffec);
  if (run != (run_container_t *)0x0) {
    vl.length = (in_SI - in_DI) - 1;
    vl.value = in_DI;
    run_container_append_first(run,vl);
  }
  return run;
}

Assistant:

static inline run_container_t *run_container_create_range(uint32_t start,
                                                          uint32_t stop) {
    run_container_t *rc = run_container_create_given_capacity(1);
    if (rc) {
        rle16_t r;
        r.value = (uint16_t)start;
        r.length = (uint16_t)(stop - start - 1);
        run_container_append_first(rc, r);
    }
    return rc;
}